

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O0

string * ktx::toString_abi_cxx11_(ktxSupercmpScheme scheme)

{
  format_args args;
  format_args args_00;
  bool bVar1;
  int in_ESI;
  char *pcVar2;
  string *in_RDI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  unaff_retaddr;
  string_view in_stack_00000008;
  string *str;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  allocator<char> *in_stack_fffffffffffffdc0;
  allocator<char> *__s;
  string *this;
  undefined1 local_214 [4];
  char *local_210 [2];
  string local_200 [36];
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_1dc;
  string local_1c8 [34];
  allocator<char> local_1a6;
  undefined1 local_1a5;
  int local_1a4;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_198 [2];
  undefined8 local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_180;
  char *local_178;
  size_t local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_168;
  char *local_160;
  size_t sStack_158;
  string *local_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_148 [3];
  undefined8 local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_128;
  char *local_120;
  size_t local_118;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_110;
  char *local_108;
  size_t sStack_100;
  string *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char **local_d8;
  char **local_d0;
  char *local_c8;
  size_t sStack_c0;
  char **local_b0;
  char *local_a8;
  size_t sStack_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_90;
  undefined8 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_80;
  undefined8 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_60;
  undefined8 local_58;
  undefined8 *local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_48;
  undefined8 local_40;
  undefined8 *local_38;
  char *local_30;
  char **local_28;
  char *local_20;
  undefined1 *local_18;
  char *local_10;
  unsigned_long_long in_stack_fffffffffffffff8;
  char *pcVar3;
  
  local_1a5 = 0;
  this = in_RDI;
  local_1a4 = in_ESI;
  ktxSupercompressionSchemeString(in_ESI);
  __s = &local_1a6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffdc0);
  std::allocator<char>::~allocator(&local_1a6);
  pcVar2 = "Invalid scheme value";
  bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  if (bVar1) {
    local_e8 = (undefined1 *)((long)&local_1dc.string.data + 4);
    local_f0 = "(0x{:08X})";
    local_20 = "(0x{:08X})";
    local_1dc.int128_value._4_8_ = (long)"Vendor or reserved scheme (0x{:08X})" + 0x1a;
    local_18 = local_e8;
    local_118 = std::char_traits<char>::length((char_type *)0x259fd5);
    local_10 = local_f0;
    local_1dc.int_value = local_1a4;
    local_f8 = local_1c8;
    local_108 = (char *)local_1dc.int128_value._4_8_;
    local_110 = &local_1dc;
    local_d0 = &local_108;
    local_120 = (char *)local_1dc.int128_value._4_8_;
    sStack_100 = local_118;
    local_c8 = local_120;
    sStack_c0 = local_118;
    local_148[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                               *)&local_110->string,(v10 *)pcVar2,(uint *)local_f8);
    local_88 = &local_130;
    local_90 = local_148;
    local_40 = 2;
    local_130 = 2;
    args.field_1.values_ = unaff_retaddr.values_;
    args.desc_ = in_stack_fffffffffffffff8;
    local_68 = local_90;
    local_48 = local_90;
    local_38 = local_88;
    local_128 = local_90;
    ::fmt::v10::vformat_abi_cxx11_(in_stack_00000008,args);
    std::__cxx11::string::operator=((string *)this,local_1c8);
    std::__cxx11::string::~string(local_1c8);
  }
  else {
    pcVar2 = "Vendor or reserved scheme";
    bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    if (bVar1) {
      local_d8 = local_210;
      local_e0 = "Vendor or reserved scheme (0x{:08X})";
      local_30 = "Vendor or reserved scheme (0x{:08X})";
      local_210[0] = "Vendor or reserved scheme (0x{:08X})";
      local_28 = local_d8;
      local_170 = std::char_traits<char>::length((char_type *)0x25a20c);
      local_214 = (undefined1  [4])local_1a4;
      local_150 = local_200;
      local_160 = local_210[0];
      local_168 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                   *)local_214;
      local_b0 = &local_160;
      local_178 = local_210[0];
      sStack_158 = local_170;
      local_a8 = local_178;
      sStack_a0 = local_170;
      pcVar3 = local_e0;
      local_198[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               (local_168,(v10 *)pcVar2,(uint *)local_150);
      local_78 = &local_188;
      local_80 = local_198;
      local_58 = 2;
      local_188 = 2;
      args_00.field_1.values_ = unaff_retaddr.values_;
      args_00.desc_ = (unsigned_long_long)pcVar3;
      local_70 = local_80;
      local_60 = local_80;
      local_50 = local_78;
      local_180 = local_80;
      ::fmt::v10::vformat_abi_cxx11_(in_stack_00000008,args_00);
      std::__cxx11::string::operator=((string *)this,local_200);
      std::__cxx11::string::~string(local_200);
    }
  }
  return in_RDI;
}

Assistant:

[[nodiscard]] inline std::string toString(ktxSupercmpScheme scheme) noexcept {
    std::string str = ktxSupercompressionSchemeString(scheme);

    if (str == "Invalid scheme value")
        str = fmt::format("(0x{:08X})", static_cast<uint32_t>(scheme));

    else if (str == "Vendor or reserved scheme")
        str = fmt::format("Vendor or reserved scheme (0x{:08X})", static_cast<uint32_t>(scheme));

    return str;
}